

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::delete_(undefined8 param_1,undefined8 param_2)

{
  undefined1 local_a;
  undefined1 local_9;
  
  delete_group_access(&local_9);
  table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::delete_(&local_a,param_2);
  return;
}

Assistant:

static void delete_(allocator_type al, concurrent_table_arrays& arrays) noexcept {
        delete_group_access(group_access_allocator_type(al), arrays);
        super::delete_(al, arrays);
    }